

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_handshake_parse_server_response(nn_ws_handshake *self)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char *__haystack;
  char *pcVar4;
  char **in_RDI;
  char **unaff_retaddr;
  char *pos;
  char **in_stack_00000010;
  int rc;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  pvVar2 = memchr((void *)((long)in_RDI + 0x128c),0,0x200);
  if (pvVar2 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "memchr (self->response, \'\\0\', sizeof (self->response))",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x43b);
    fflush(_stderr);
    nn_err_abort();
  }
  sVar3 = strlen((char *)((long)in_RDI + 0x128c));
  if (0x1ff < sVar3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "strlen (self->response) < sizeof (self->response)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x43f);
    fflush(_stderr);
    nn_err_abort();
  }
  __haystack = (char *)((long)in_RDI + 0x128c);
  pcVar4 = strstr(__haystack,"\r\n\r\n");
  if (pcVar4 == (char *)0x0) {
    iVar5 = 1;
  }
  else {
    in_RDI[0x249] = (char *)0x0;
    in_RDI[0x24b] = (char *)0x0;
    in_RDI[0x241] = (char *)0x0;
    in_RDI[0x243] = (char *)0x0;
    in_RDI[0x239] = (char *)0x0;
    in_RDI[0x23b] = (char *)0x0;
    in_RDI[0x23d] = (char *)0x0;
    in_RDI[0x23f] = (char *)0x0;
    in_RDI[0x24a] = (char *)0x0;
    in_RDI[0x24c] = (char *)0x0;
    in_RDI[0x242] = (char *)0x0;
    in_RDI[0x244] = (char *)0x0;
    in_RDI[0x23a] = (char *)0x0;
    in_RDI[0x23c] = (char *)0x0;
    in_RDI[0x23e] = (char *)0x0;
    in_RDI[0x240] = (char *)0x0;
    iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    if (iVar5 == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,unaff_retaddr,
                                (size_t *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar5 == 0) {
        iVar5 = 1;
      }
      else {
        iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,unaff_retaddr,
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar5 == 0) {
          iVar5 = 1;
        }
        else {
          while (sVar3 = strlen(__haystack), sVar3 != 0) {
            iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),in_RDI,
                                      in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
            if (iVar5 == 0) {
              iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                         in_stack_fffffffffffffff8),in_RDI,
                                        in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
              if (iVar5 == 1) {
                iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                          unaff_retaddr,
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8));
              }
              else {
                iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                           in_stack_fffffffffffffff8),in_RDI,
                                          in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
                if (iVar5 == 1) {
                  iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                            unaff_retaddr,
                                            (size_t *)
                                            CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8));
                }
                else {
                  iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                             in_stack_fffffffffffffff8),in_RDI,
                                            in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
                  if (iVar5 == 1) {
                    iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                              unaff_retaddr,
                                              (size_t *)
                                              CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8));
                  }
                  else {
                    iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                               in_stack_fffffffffffffff8),in_RDI,
                                              in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
                    if (iVar5 == 1) {
                      iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                                unaff_retaddr,
                                                (size_t *)
                                                CONCAT44(in_stack_fffffffffffffffc,
                                                         in_stack_fffffffffffffff8));
                    }
                    else {
                      iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                                 in_stack_fffffffffffffff8),in_RDI,
                                                in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                      ;
                      if (iVar5 == 1) {
                        iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                                  unaff_retaddr,
                                                  (size_t *)
                                                  CONCAT44(in_stack_fffffffffffffffc,
                                                           in_stack_fffffffffffffff8));
                      }
                      else {
                        iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                                   in_stack_fffffffffffffff8),in_RDI
                                                  ,in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8);
                        if (iVar5 == 1) {
                          iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,
                                                    (int)pos,unaff_retaddr,
                                                    (size_t *)
                                                    CONCAT44(in_stack_fffffffffffffffc,
                                                             in_stack_fffffffffffffff8));
                        }
                        else {
                          iVar5 = nn_ws_match_token((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                                     in_stack_fffffffffffffff8),
                                                    in_RDI,in_stack_ffffffffffffffec,
                                                    in_stack_ffffffffffffffe8);
                          if (iVar5 == 1) break;
                          iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,
                                                    (int)pos,unaff_retaddr,
                                                    (size_t *)
                                                    CONCAT44(in_stack_fffffffffffffffc,
                                                             in_stack_fffffffffffffff8));
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar5 = nn_ws_match_value((char *)self,in_stack_00000010,pos._4_4_,(int)pos,
                                        unaff_retaddr,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ));
            }
            if (iVar5 != 1) {
              return 1;
            }
            in_stack_ffffffffffffffec = 1;
          }
          sVar3 = strlen(__haystack);
          iVar5 = (int)((ulong)__haystack >> 0x20);
          if (sVar3 != 0) {
            nn_backtrace_print();
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (pos) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x4a0);
            fflush(_stderr);
            nn_err_abort();
          }
          if ((((in_RDI[0x249] == (char *)0x0) || (in_RDI[0x239] == (char *)0x0)) ||
              (in_RDI[0x23b] == (char *)0x0)) || (in_RDI[0x243] == (char *)0x0)) {
            iVar5 = -1;
          }
          else {
            iVar1 = nn_ws_validate_value
                              ((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                               ,(char *)in_RDI,
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),iVar5);
            if (iVar1 == 1) {
              iVar1 = nn_ws_validate_value
                                ((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),(char *)in_RDI,
                                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),iVar5
                                );
              if (iVar1 == 1) {
                iVar1 = nn_ws_validate_value
                                  ((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),(char *)in_RDI,
                                   CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                                   iVar5);
                if (iVar1 == 1) {
                  iVar5 = nn_ws_validate_value
                                    ((char *)CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),(char *)in_RDI,
                                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                                     iVar5);
                  if (iVar5 == 1) {
                    iVar5 = 0;
                  }
                  else {
                    iVar5 = -1;
                  }
                }
                else {
                  iVar5 = -1;
                }
              }
              else {
                iVar5 = -1;
              }
            }
            else {
              iVar5 = -1;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int nn_ws_handshake_parse_server_response (struct nn_ws_handshake *self)
{
    /*  As per RFC 6455 section 1.7, this parser is not intended to be a
        general-purpose parser for arbitrary HTTP headers. As with the design
        philosophy of nanomsg, application-specific exchanges are better
        reserved for accepted connections, not as fields within these
        headers. */

    int rc;
    const char *pos;

    /*  Guarantee that a NULL terminator exists to enable treating this
        recv buffer like a string. The lack of such would indicate a failure
        upstream to catch a buffer overflow. */
    nn_assert (memchr (self->response, '\0', sizeof (self->response)));

    /*  Having found the NULL terminator, from this point forward string
        functions may be used. */
    nn_assert (strlen (self->response) < sizeof (self->response));

    pos = self->response;

    /*  Is the response from the server fully received? */
    if (!strstr (pos, NN_WS_HANDSHAKE_TERMSEQ))
        return NN_WS_HANDSHAKE_RECV_MORE;

    self->status_code = NULL;
    self->reason_phrase = NULL;
    self->server = NULL;
    self->accept_key = NULL;
    self->upgrade = NULL;
    self->conn = NULL;
    self->version = NULL;
    self->protocol = NULL;

    self->status_code_len = 0;
    self->reason_phrase_len = 0;
    self->server_len = 0;
    self->accept_key_len = 0;
    self->upgrade_len = 0;
    self->conn_len = 0;
    self->version_len = 0;
    self->protocol_len = 0;

    /*  RFC 7230 3.1.2 Status Line: HTTP Version. */
    if (!nn_ws_match_token ("HTTP/1.1\x20", &pos, 0, 0))
        return NN_WS_HANDSHAKE_RECV_MORE;

    /*  RFC 7230 3.1.2 Status Line: Status Code. */
    if (!nn_ws_match_value ("\x20", &pos, 0, 0, &self->status_code,
        &self->status_code_len))
        return NN_WS_HANDSHAKE_RECV_MORE;

    /*  RFC 7230 3.1.2 Status Line: Reason Phrase. */
    if (!nn_ws_match_value (CRLF, &pos, 0, 0,
        &self->reason_phrase, &self->reason_phrase_len))
        return NN_WS_HANDSHAKE_RECV_MORE;

    /*  It's expected the current position is now at the first
        header field. Match them one by one. */
    while (strlen (pos))
    {
        if (nn_ws_match_token ("Server:", &pos, 1, 0)) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->server, &self->server_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Accept:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->accept_key, &self->accept_key_len);
        }
        else if (nn_ws_match_token ("Upgrade:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->upgrade, &self->upgrade_len);
        }
        else if (nn_ws_match_token ("Connection:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->conn, &self->conn_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Version-Server:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->version, &self->version_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Protocol-Server:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->protocol, &self->protocol_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Extensions:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->extensions, &self->extensions_len);
        }
        else if (nn_ws_match_token (CRLF,
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            /*  Exit loop since all headers are parsed. */
            break;
        }
        else {
            /*  Skip unknown headers. */
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                NULL, NULL);
        }

        if (rc != NN_WS_HANDSHAKE_MATCH)
            return NN_WS_HANDSHAKE_RECV_MORE;
    }

    /*  Validate the opening handshake is now fully parsed. Additionally,
        as per RFC 6455 section 4.1, the client should not send additional data
        after the opening handshake, so this assertion validates upstream recv
        logic prevented this case. */
    nn_assert (strlen (pos) == 0);

    /*  TODO: protocol expectations below this point are hard-coded here as
        an initial design decision. Perhaps in the future these values should
        be settable via compile time (or run-time socket) options? */

    /*  These header fields are required as per RFC 6455 4.2.2. */
    if (!self->status_code || !self->upgrade || !self->conn ||
        !self->accept_key)
        return NN_WS_HANDSHAKE_INVALID;

    /*  TODO: Currently, we only handle a successful connection upgrade.
        Anything else is treated as a failed connection.
        Consider handling other scenarios like 3xx redirects. */
    if (nn_ws_validate_value ("101", self->status_code,
        self->status_code_len, 1) != NN_WS_HANDSHAKE_MATCH)
        return NN_WS_HANDSHAKE_INVALID;

    /*  RFC 6455 section 4.2.2.5.2 (version December 2011). */
    if (nn_ws_validate_value ("websocket", self->upgrade,
        self->upgrade_len, 1) != NN_WS_HANDSHAKE_MATCH)
        return NN_WS_HANDSHAKE_INVALID;

    /*  RFC 6455 section 4.2.2.5.3 (version December 2011). */
    if (nn_ws_validate_value ("Upgrade", self->conn,
        self->conn_len, 1) != NN_WS_HANDSHAKE_MATCH)
        return NN_WS_HANDSHAKE_INVALID;

    /*  RFC 6455 section 4.2.2.5.4 (version December 2011). */
    if (nn_ws_validate_value (self->expected_accept_key, self->accept_key,
        self->accept_key_len, 1) != NN_WS_HANDSHAKE_MATCH)
        return NN_WS_HANDSHAKE_INVALID;

    /*  Server response meets RFC 6455 compliance for opening handshake. */
    return NN_WS_HANDSHAKE_VALID;
}